

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFontGlyphRangesBuilder::AddText(ImFontGlyphRangesBuilder *this,char *text,char *text_end)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint c;
  
  while( true ) {
    if (text_end == (char *)0x0) {
      uVar2 = (uint)*text;
    }
    else {
      uVar2 = (uint)(text < text_end);
    }
    if (uVar2 == 0) break;
    c = 0;
    iVar3 = ImTextCharFromUtf8(&c,text,text_end);
    if (iVar3 == 0) {
      return;
    }
    if (c < 0x10000) {
      puVar1 = (uint *)(*(long *)(this + 8) + (ulong)(c >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)c & 0x1f);
    }
    text = text + iVar3;
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddText(const char* text, const char* text_end)
{
    while (text_end ? (text < text_end) : *text)
    {
        unsigned int c = 0;
        int c_len = ImTextCharFromUtf8(&c, text, text_end);
        text += c_len;
        if (c_len == 0)
            break;
        if (c < 0x10000)
            AddChar((ImWchar)c);
    }
}